

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean jpeg_resync_to_restart(j_decompress_ptr cinfo,int desired)

{
  boolean bVar1;
  int local_24;
  int local_20;
  int action;
  int marker;
  int desired_local;
  j_decompress_ptr cinfo_local;
  
  local_20 = cinfo->unread_marker;
  cinfo->err->msg_code = 0x7c;
  (cinfo->err->msg_parm).i[0] = local_20;
  (cinfo->err->msg_parm).i[1] = desired;
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
  while( true ) {
    if (local_20 < 0xc0) {
      local_24 = 2;
    }
    else if ((local_20 < 0xd0) || (0xd7 < local_20)) {
      local_24 = 3;
    }
    else if ((local_20 == (desired + 1U & 7) + 0xd0) || (local_20 == (desired + 2U & 7) + 0xd0)) {
      local_24 = 3;
    }
    else if ((local_20 == (desired - 1U & 7) + 0xd0) || (local_20 == (desired - 2U & 7) + 0xd0)) {
      local_24 = 2;
    }
    else {
      local_24 = 1;
    }
    cinfo->err->msg_code = 99;
    (cinfo->err->msg_parm).i[0] = local_20;
    (cinfo->err->msg_parm).i[1] = local_24;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,4);
    if (local_24 == 1) break;
    if (local_24 == 2) {
      bVar1 = next_marker(cinfo);
      if (bVar1 == 0) {
        return 0;
      }
      local_20 = cinfo->unread_marker;
    }
    else if (local_24 == 3) {
      return 1;
    }
  }
  cinfo->unread_marker = 0;
  return 1;
}

Assistant:

GLOBAL(boolean)
jpeg_resync_to_restart (j_decompress_ptr cinfo, int desired)
{
  int marker = cinfo->unread_marker;
  int action = 1;
  
  /* Always put up a warning. */
  WARNMS2(cinfo, JWRN_MUST_RESYNC, marker, desired);
  
  /* Outer loop handles repeated decision after scanning forward. */
  for (;;) {
    if (marker < (int) M_SOF0)
      action = 2;		/* invalid marker */
    else if (marker < (int) M_RST0 || marker > (int) M_RST7)
      action = 3;		/* valid non-restart marker */
    else {
      if (marker == ((int) M_RST0 + ((desired+1) & 7)) ||
	  marker == ((int) M_RST0 + ((desired+2) & 7)))
	action = 3;		/* one of the next two expected restarts */
      else if (marker == ((int) M_RST0 + ((desired-1) & 7)) ||
	       marker == ((int) M_RST0 + ((desired-2) & 7)))
	action = 2;		/* a prior restart, so advance */
      else
	action = 1;		/* desired restart or too far away */
    }
    TRACEMS2(cinfo, 4, JTRC_RECOVERY_ACTION, marker, action);
    switch (action) {
    case 1:
      /* Discard marker and let entropy decoder resume processing. */
      cinfo->unread_marker = 0;
      return TRUE;
    case 2:
      /* Scan to the next marker, and repeat the decision loop. */
      if (! next_marker(cinfo))
	return FALSE;
      marker = cinfo->unread_marker;
      break;
    case 3:
      /* Return without advancing past this marker. */
      /* Entropy decoder will be forced to process an empty segment. */
      return TRUE;
    }
  } /* end loop */
}